

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CutPerformCheck16(If_Man_t *p,uint *pTruth0,int nVars,int nLeaves,char *pStr)

{
  char *pcVar1;
  If_Par_t *pIVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  byte bVar6;
  uint uVar7;
  size_t sVar8;
  byte bVar9;
  byte bVar10;
  int nLutRoot;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  word (*pawVar18) [3];
  uint *puVar19;
  long lVar20;
  uint *puVar21;
  long lVar22;
  int nLutLeaf;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  uint *puVar27;
  uint *puVar28;
  uint *puVar29;
  int nVars_00;
  uint *puVar30;
  If_Grp_t local_104a;
  uint pTruth [1024];
  
  if (nVars < 6) {
    __assert_fail("nVars >= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDec16.c"
                  ,0x8ae,"int If_CutPerformCheck16(If_Man_t *, unsigned int *, int, int, char *)");
  }
  uVar23 = (ulong)(uint)nLeaves;
  uVar7 = 1 << ((char)nVars - 6U & 0x1f);
  puVar29 = pTruth;
  memcpy(puVar29,pTruth0,(long)(int)uVar7 * 8);
  pIVar2 = p->pPars;
  iVar14 = pIVar2->nLutSize;
  if (iVar14 != nLeaves) {
    if (iVar14 <= nLeaves) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    uVar16 = (ulong)(uint)(1 << ((char)nLeaves - 6U & 0x1f));
    if (nLeaves < 7) {
      uVar16 = 1;
    }
    iVar25 = 1 << ((char)iVar14 - 6U & 0x1f);
    if (iVar14 < 7) {
      iVar25 = 1;
    }
    iVar14 = (int)uVar16;
    if (iVar14 != iVar25) {
      if (iVar25 <= iVar14) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      lVar13 = 0;
      uVar12 = 0;
      if (0 < iVar14) {
        uVar12 = uVar16;
      }
      for (; lVar13 < iVar25; lVar13 = lVar13 + iVar14) {
        for (uVar16 = 0; uVar12 != uVar16; uVar16 = uVar16 + 1) {
          *(undefined8 *)(puVar29 + uVar16 * 2) = *(undefined8 *)(pTruth + uVar16 * 2);
        }
        puVar29 = puVar29 + (long)iVar14 * 2;
      }
    }
  }
  if (pIVar2->fCutMin == 0) {
    if (nVars < nLeaves) {
      __assert_fail("nVars <= nVarsAll",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
    }
    puVar29 = pTruth + (long)(int)uVar7 * 2;
    uVar12 = 0;
    uVar16 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      uVar16 = uVar12;
    }
    uVar11 = 0;
    if (0 < nLeaves) {
      uVar11 = (ulong)(uint)nLeaves;
    }
    uVar23 = 0;
    for (; iVar14 = (int)uVar23, uVar12 != uVar11; uVar12 = uVar12 + 1) {
      lVar13 = (long)iVar14;
      bVar10 = (byte)uVar12;
      bVar9 = (byte)uVar23;
      if (nVars == 6) {
        bVar10 = (byte)(1 << (bVar10 & 0x1f));
        if ((s_Truths6Neg[uVar12] & ((ulong)pTruth._0_8_ >> (bVar10 & 0x3f) ^ pTruth._0_8_)) != 0) {
          if (lVar13 < (long)uVar12) {
            bVar10 = (char)(-1 << (bVar9 & 0x1f)) + bVar10;
            uVar23 = (pTruth._0_8_ & s_PPMasks[lVar13][uVar12][2]) >> (bVar10 & 0x3f) |
                     (s_PPMasks[lVar13][uVar12][1] & pTruth._0_8_) << (bVar10 & 0x3f) |
                     s_PPMasks[lVar13][uVar12][0] & pTruth._0_8_;
            pTruth[0] = (int)uVar23;
            pTruth[1] = (int)(uVar23 >> 0x20);
          }
LAB_0037d17c:
          uVar23 = (ulong)(iVar14 + 1);
        }
      }
      else {
        if (uVar12 < 6) {
          uVar17 = 0;
          do {
            if (uVar16 == uVar17) goto LAB_0037d195;
            lVar26 = uVar17 * 2;
            uVar17 = uVar17 + 1;
          } while ((s_Truths6Neg[uVar12] &
                   (*(ulong *)(pTruth + lVar26) >> ((byte)(1 << (bVar10 & 0x1f)) & 0x3f) ^
                   *(ulong *)(pTruth + lVar26))) == 0);
LAB_0037cf1f:
          if (lVar13 < (long)uVar12) {
            if (uVar12 < 6) {
              pawVar18 = s_PPMasks[lVar13] + uVar12;
              bVar10 = (char)(-1 << (bVar9 & 0x1f)) + (char)(1 << (bVar10 & 0x1f));
              for (uVar23 = 0; uVar16 != uVar23; uVar23 = uVar23 + 1) {
                uVar17 = *(ulong *)(pTruth + uVar23 * 2);
                *(ulong *)(pTruth + uVar23 * 2) =
                     (uVar17 & (*pawVar18)[2]) >> (bVar10 & 0x3f) |
                     ((*pawVar18)[1] & uVar17) << (bVar10 & 0x3f) | (*pawVar18)[0] & uVar17;
              }
            }
            else if (iVar14 < 6) {
              uVar7 = 1 << (bVar10 - 6 & 0x1f);
              uVar23 = 0;
              if (0 < (int)uVar7) {
                uVar23 = (ulong)uVar7;
              }
              lVar26 = (long)(2 << (bVar10 - 6 & 0x1f));
              puVar19 = pTruth + (long)(int)uVar7 * 2;
              for (puVar21 = pTruth; puVar21 < puVar29; puVar21 = puVar21 + lVar26 * 2) {
                for (uVar17 = 0; uVar23 != uVar17; uVar17 = uVar17 + 1) {
                  uVar24 = *(ulong *)(puVar21 + uVar17 * 2);
                  uVar3 = Truth6[lVar13];
                  bVar10 = (byte)(1 << (bVar9 & 0x1f));
                  uVar4 = *(ulong *)(puVar19 + uVar17 * 2);
                  *(ulong *)(puVar21 + uVar17 * 2) =
                       (uVar4 << (bVar10 & 0x3f) ^ uVar24) & uVar3 ^ uVar24;
                  *(ulong *)(puVar19 + uVar17 * 2) =
                       uVar4 & uVar3 | (uVar3 & uVar24) >> (bVar10 & 0x3f);
                }
                puVar19 = puVar19 + lVar26 * 2;
              }
            }
            else {
              bVar6 = bVar9 - 6 & 0x1f;
              uVar7 = 1 << bVar6;
              lVar13 = (long)(2 << (bVar10 - 6 & 0x1f));
              uVar23 = 0;
              if (0 < 1 << bVar6) {
                uVar23 = (ulong)uVar7;
              }
              lVar20 = (long)(2 << (bVar9 - 6 & 0x1f));
              lVar26 = (long)(1 << (bVar10 - 6 & 0x1f));
              puVar19 = pTruth + lVar26 * 2;
              puVar27 = pTruth + (long)(int)uVar7 * 2;
              for (puVar21 = pTruth; puVar21 < puVar29; puVar21 = puVar21 + lVar13 * 2) {
                puVar28 = puVar27;
                puVar30 = puVar19;
                for (lVar22 = 0; lVar22 < lVar26; lVar22 = lVar22 + lVar20) {
                  for (uVar17 = 0; uVar23 != uVar17; uVar17 = uVar17 + 1) {
                    uVar5 = *(undefined8 *)(puVar28 + uVar17 * 2);
                    *(undefined8 *)(puVar28 + uVar17 * 2) = *(undefined8 *)(puVar30 + uVar17 * 2);
                    *(undefined8 *)(puVar30 + uVar17 * 2) = uVar5;
                  }
                  puVar30 = puVar30 + lVar20 * 2;
                  puVar28 = puVar28 + lVar20 * 2;
                }
                puVar19 = puVar19 + lVar13 * 2;
                puVar27 = puVar27 + lVar13 * 2;
              }
            }
          }
          goto LAB_0037d17c;
        }
        uVar7 = 1 << (bVar10 - 6 & 0x1f);
        uVar17 = 0;
        if (0 < (int)uVar7) {
          uVar17 = (ulong)uVar7;
        }
        lVar26 = (long)(2 << (bVar10 - 6 & 0x1f));
        puVar19 = pTruth + (long)(int)uVar7 * 2;
        for (puVar21 = pTruth; puVar21 < puVar29; puVar21 = puVar21 + lVar26 * 2) {
          uVar24 = 0;
          while (uVar17 != uVar24) {
            lVar20 = uVar24 * 2;
            lVar22 = uVar24 * 2;
            uVar24 = uVar24 + 1;
            if (*(long *)(puVar21 + lVar20) != *(long *)(puVar19 + lVar22)) goto LAB_0037cf1f;
          }
          puVar19 = puVar19 + lVar26 * 2;
        }
      }
LAB_0037d195:
    }
    if (nLeaves < iVar14) {
      __assert_fail("k < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
    }
  }
  sVar8 = strlen(pStr);
  iVar14 = (int)sVar8;
  if (iVar14 - 4U < 0xfffffffe) {
    printf("Wrong LUT struct (%s)\n",pStr);
  }
  else {
    uVar16 = 0;
    do {
      if ((sVar8 & 0xffffffff) == uVar16) {
        iVar25 = 0;
        if (iVar14 == 3) {
          iVar25 = pStr[1] + -0x30;
        }
        iVar15 = iVar25 + -1;
        if (iVar25 == 0) {
          iVar15 = 0;
        }
        nVars_00 = (int)uVar23;
        if ((int)pStr[iVar14 - 1] + iVar15 + *pStr + -0x61 < nVars_00) {
          printf("The cut size (%d) is too large for the LUT structure %s.\n",uVar23,pStr);
          return 0;
        }
        nLutLeaf = *pStr + -0x30;
        nLutRoot = pStr[iVar14 - 1] + -0x30;
        iVar15 = nLutRoot;
        if (nLutRoot < nLutLeaf) {
          iVar15 = nLutLeaf;
        }
        if (iVar15 < iVar25) {
          iVar15 = iVar25;
        }
        if (iVar15 < nVars_00) {
          if (iVar14 == 2) {
            If_CluCheck(&local_104a,p,(word *)pTruth,nVars_00,0,0,nLutLeaf,nLutRoot,(If_Grp_t *)0x0,
                        (word *)0x0,(word *)0x0,(word *)0x0,1);
          }
          else {
            If_CluCheck3(&local_104a,p,(word *)pTruth,nVars_00,nLutLeaf,iVar25,nLutRoot,
                         (If_Grp_t *)0x0,(If_Grp_t *)0x0,(word *)0x0,(word *)0x0,(word *)0x0);
          }
          return (uint)('\0' < local_104a.nVars);
        }
        return 1;
      }
      pcVar1 = pStr + uVar16;
      uVar16 = uVar16 + 1;
    } while (0xfb < (byte)(*pcVar1 - 0x37U));
    printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)*pcVar1 - 0x30));
  }
  return 0;
}

Assistant:

int If_CutPerformCheck16( If_Man_t * p, unsigned * pTruth0, int nVars, int nLeaves, char * pStr )
{
    unsigned pTruth[IF_MAX_FUNC_LUTSIZE > 5 ? 1 << (IF_MAX_FUNC_LUTSIZE - 5) : 1];
    If_Grp_t G1 = {0};//, G3 = {0};
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;
    // stretch the truth table
    assert( nVars >= 6 );
    memcpy( pTruth, pTruth0, sizeof(word) * Abc_TtWordNum(nVars) );
    Abc_TtStretch6( (word *)pTruth, nLeaves, p->pPars->nLutSize );

#ifdef IF_TRY_NEW
    {
        word pCopy[1024];
        int nWords = Abc_TruthWordNum(nVars);
        int iNum;
        if ( s_vTtMem == NULL )
        {
            s_vTtMem = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem, 10000 );
        }
        if ( s_vTtMem2 == NULL )
        {
            s_vTtMem2 = Vec_MemAlloc( Abc_Truth6WordNum(nVars), 12 ); // 32 KB/page for 6-var functions
            Vec_MemHashAlloc( s_vTtMem2, 10000 );
        }
        memcpy( pCopy, pTruth, sizeof(word) * Abc_Truth6WordNum(nVars) );
        if ( pCopy[0] & 1 )
            for ( i = 0; i < nWords; i++ )
                pCopy[i] = ~pCopy[i];
        iNum = Vec_MemHashInsert( s_vTtMem, pCopy );
        if ( iNum == Vec_MemEntryNum(s_vTtMem) - 1 )
        {
            int pCanonPerm[16];
            char pCanonPermC[16];
            Abc_TtCanonicize( pCopy, nVars, pCanonPermC );
//            If_CluSemiCanonicize( pCopy, nVars, pCanonPerm );
            Vec_MemHashInsert( s_vTtMem2, pCopy );
        }
    }
#endif

    // if cutmin is disabled, minimize the function
    if ( !p->pPars->fCutMin )
        nLeaves = Abc_TtMinBase( (word *)pTruth, NULL, nLeaves, nVars );

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return 0;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return 0;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The cut size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return 0;
    }
    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
        return 1;

    // derive the first group
    if ( Length == 2 )
        G1 = If_CluCheck( p, (word *)pTruth, nLeaves, 0, 0, nLutLeaf, nLutRoot, NULL, NULL, NULL, NULL, 1 );
    else
        G1 = If_CluCheck3( p, (word *)pTruth, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, NULL, NULL, NULL, NULL, NULL );

//    if ( G1.nVars > 0 )
//        If_CluPrintGroup( &G1 );

    return (int)(G1.nVars > 0);
}